

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void destroy_context(Context *ctx)

{
  void *d;
  ConstantsList *pCVar1;
  VariableList *pVVar2;
  ConstantsList *pCVar3;
  VariableList *pVVar4;
  code *UNRECOVERED_JUMPTABLE;
  
  if (ctx != (Context *)0x0) {
    UNRECOVERED_JUMPTABLE = ctx->free;
    if (UNRECOVERED_JUMPTABLE == (MOJOSHADER_free)0x0) {
      UNRECOVERED_JUMPTABLE = MOJOSHADER_internal_free;
    }
    d = ctx->malloc_data;
    buffer_destroy(ctx->preflight);
    buffer_destroy(ctx->globals);
    buffer_destroy(ctx->inputs);
    buffer_destroy(ctx->outputs);
    buffer_destroy(ctx->helpers);
    buffer_destroy(ctx->subroutines);
    buffer_destroy(ctx->mainline_intro);
    buffer_destroy(ctx->mainline_arguments);
    buffer_destroy(ctx->mainline_top);
    buffer_destroy(ctx->mainline);
    buffer_destroy(ctx->postflight);
    buffer_destroy(ctx->ignore);
    pCVar3 = ctx->constants;
    while (pCVar3 != (ConstantsList *)0x0) {
      pCVar1 = pCVar3->next;
      (*UNRECOVERED_JUMPTABLE)(pCVar3,d);
      pCVar3 = pCVar1;
    }
    free_reglist(UNRECOVERED_JUMPTABLE,d,(ctx->used_registers).next);
    free_reglist(UNRECOVERED_JUMPTABLE,d,(ctx->defined_registers).next);
    free_reglist(UNRECOVERED_JUMPTABLE,d,(ctx->uniforms).next);
    free_reglist(UNRECOVERED_JUMPTABLE,d,(ctx->attributes).next);
    free_reglist(UNRECOVERED_JUMPTABLE,d,(ctx->samplers).next);
    pVVar4 = ctx->variables;
    while (pVVar4 != (VariableList *)0x0) {
      pVVar2 = pVVar4->next;
      (*UNRECOVERED_JUMPTABLE)(pVVar4,d);
      pVVar4 = pVVar2;
    }
    errorlist_destroy(ctx->errors);
    free_symbols(UNRECOVERED_JUMPTABLE,d,(ctx->ctab).symbols,(ctx->ctab).symbol_count);
    MOJOSHADER_freePreshader(ctx->preshader);
    (*UNRECOVERED_JUMPTABLE)(ctx->mainfn,d);
    (*UNRECOVERED_JUMPTABLE)(ctx,d);
    return;
  }
  return;
}

Assistant:

static void destroy_context(Context *ctx)
{
    if (ctx != NULL)
    {
        MOJOSHADER_free f = ((ctx->free != NULL) ? ctx->free : MOJOSHADER_internal_free);
        void *d = ctx->malloc_data;
        buffer_destroy(ctx->preflight);
        buffer_destroy(ctx->globals);
        buffer_destroy(ctx->inputs);
        buffer_destroy(ctx->outputs);
        buffer_destroy(ctx->helpers);
        buffer_destroy(ctx->subroutines);
        buffer_destroy(ctx->mainline_intro);
        buffer_destroy(ctx->mainline_arguments);
        buffer_destroy(ctx->mainline_top);
        buffer_destroy(ctx->mainline);
        buffer_destroy(ctx->postflight);
        buffer_destroy(ctx->ignore);
        free_constants_list(f, d, ctx->constants);
        free_reglist(f, d, ctx->used_registers.next);
        free_reglist(f, d, ctx->defined_registers.next);
        free_reglist(f, d, ctx->uniforms.next);
        free_reglist(f, d, ctx->attributes.next);
        free_reglist(f, d, ctx->samplers.next);
        free_variable_list(f, d, ctx->variables);
        errorlist_destroy(ctx->errors);
        free_symbols(f, d, ctx->ctab.symbols, ctx->ctab.symbol_count);
        MOJOSHADER_freePreshader(ctx->preshader);
        f((void *) ctx->mainfn, d);
        f(ctx, d);
    } // if
}